

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsDemuxer.cpp
# Opt level: O1

int __thiscall
TSDemuxer::simpleDemuxBlock
          (TSDemuxer *this,DemuxedData *demuxedData,PIDSet *acceptedPIDs,int64_t *discardSize)

{
  size_t num;
  undefined1 uVar1;
  long lVar2;
  uint8_t *__src;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  _Rb_tree_node_base *p_Var8;
  _Base_ptr p_Var9;
  undefined4 extraout_var;
  ulong uVar10;
  TS_program_map_section *this_00;
  _Base_ptr p_Var11;
  int64_t iVar12;
  int64_t iVar13;
  _Rb_tree_header *p_Var14;
  mapped_type *pmVar15;
  undefined4 *puVar16;
  _Rb_tree_header *p_Var17;
  _Rb_tree_color _Var18;
  long lVar19;
  size_t sVar20;
  byte bVar21;
  PESPacket *this_01;
  _Rb_tree_header *p_Var22;
  pointer puVar23;
  _Rb_tree_color _Var24;
  PIDSet *__range2;
  _Rb_tree_color *p_Var25;
  _Rb_tree_color *end;
  bool isFirstBlock;
  PESPacket *pesPacket;
  uint32_t readedBytes;
  int readRez;
  TS_program_association_section pat;
  int acceptedPID;
  uint8_t pmtBuffer [4096];
  uint local_1244;
  _Rb_tree_header *local_1240;
  TS_program_map_section *local_1238;
  _Rb_tree_color *local_1230;
  int local_1224;
  map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_> *local_1220;
  _Rb_tree_header *local_1218;
  undefined1 *local_1210;
  undefined8 local_1208;
  undefined1 local_1200;
  undefined7 uStack_11ff;
  undefined8 uStack_11f8;
  long *local_11f0;
  TS_program_association_section local_11e8;
  _Rb_tree_color local_11b0 [94];
  uint8_t local_1038 [4104];
  
  if (this->m_firstDemuxCall == true) {
    for (p_Var8 = (acceptedPIDs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var8 != &(acceptedPIDs->_M_t)._M_impl.super__Rb_tree_header;
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
      this->m_acceptedPidCache[(int)p_Var8[1]._M_color] = '\x01';
    }
    this->m_firstDemuxCall = false;
  }
  memset(local_1038,0,0x1000);
  p_Var9 = (acceptedPIDs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var14 = &(acceptedPIDs->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var9 != p_Var14) {
    do {
      local_11b0[0] = p_Var9[1]._M_color;
      std::
      map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>::
      operator[](demuxedData,(key_type_conflict *)local_11b0);
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != p_Var14);
  }
  *discardSize = 0;
  local_1224 = 0;
  iVar5 = (*this->m_bufferedReader->_vptr_AbstractReader[2])
                    (this->m_bufferedReader,(ulong)(uint)this->m_readerID,&local_1244,&local_1224);
  if (local_1224 == 2) {
    this->m_lastReadRez = 2;
    iVar5 = 2;
  }
  else if ((this->m_tmpBufferLen + (ulong)local_1244 == 0) ||
          ((local_1244 == 0 && (this->m_lastReadRez == 1)))) {
    this->m_lastReadRez = local_1224;
    iVar5 = 1;
  }
  else {
    if (local_1244 != 0) {
      (*this->m_bufferedReader->_vptr_AbstractReader[5])
                (this->m_bufferedReader,(ulong)(uint)this->m_readerID);
    }
    this->m_lastReadRez = local_1224;
    p_Var25 = (_Rb_tree_color *)(CONCAT44(extraout_var,iVar5) + 0xbc);
    sVar20 = this->m_tmpBufferLen;
    if (0 < (long)sVar20) {
      memcpy((void *)((long)p_Var25 - sVar20),this->m_tmpBuffer,sVar20);
      p_Var25 = (_Rb_tree_color *)((long)p_Var25 - this->m_tmpBufferLen);
      local_1244 = local_1244 + (int)this->m_tmpBufferLen;
      this->m_tmpBufferLen = 0;
    }
    *discardSize = 0;
    uVar10 = (ulong)local_1244;
    if (uVar10 < 0xbc) {
      *discardSize = uVar10;
      iVar5 = 0;
    }
    else {
      end = (_Rb_tree_color *)((long)p_Var25 + (uVar10 - 0xbc));
      if ((this->m_firstCall == true) && (this->m_m2tsMode == false)) {
        bVar3 = checkForRealM2ts(this,(uint8_t *)p_Var25,(uint8_t *)end);
        this->m_m2tsMode = bVar3;
        this->m_firstCall = false;
      }
      bVar21 = this->m_m2tsHdrDiscarded;
      local_1230 = p_Var25;
      if (((this->m_pmt).pidList._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
         (bVar3 = mvcContinueExpected(this), bVar3)) {
        TS_program_association_section::TS_program_association_section(&local_11e8);
        this->m_curPos = (uint8_t *)local_1230;
        if (local_1230 <= end) {
          local_1238 = &this->m_pmt;
          iVar5 = 0;
          p_Var25 = local_1230;
          local_11f0 = discardSize;
          do {
            p_Var14 = &local_11e8.pmtPids._M_t._M_impl.super__Rb_tree_header;
            if (((bVar21 & 1) == 0) && (this->m_m2tsMode == true)) {
              this->m_curPos = (uint8_t *)(p_Var25 + 1);
            }
            p_Var25 = (_Rb_tree_color *)this->m_curPos;
            uVar1 = (undefined1)*p_Var25;
            while ((uVar1 != 0x47 && (p_Var25 <= end))) {
              p_Var25 = (_Rb_tree_color *)((long)p_Var25 + 1);
              this->m_curPos = (uint8_t *)p_Var25;
              uVar1 = *(undefined1 *)p_Var25;
            }
            if (end < p_Var25) break;
            _Var24 = *p_Var25;
            uVar6 = (byte)(char)p_Var25[1] + 5;
            if ((_Var24 >> 0x1d & 1) == 0) {
              uVar6 = 4;
            }
            if (0xbc < uVar6) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_11b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_11b0,"Invalid tsPacket->getHeaderSize",0x1f);
              puVar16 = (undefined4 *)__cxa_allocate_exception(0x28);
              std::__cxx11::stringbuf::str();
              *puVar16 = 3;
              *(undefined4 **)(puVar16 + 2) = puVar16 + 6;
              if (local_1210 == &local_1200) {
                *(ulong *)(puVar16 + 6) = CONCAT71(uStack_11ff,local_1200);
                *(undefined8 *)(puVar16 + 8) = uStack_11f8;
              }
              else {
                *(undefined1 **)(puVar16 + 2) = local_1210;
                *(ulong *)(puVar16 + 6) = CONCAT71(uStack_11ff,local_1200);
              }
              *(undefined8 *)(puVar16 + 4) = local_1208;
              local_1208 = 0;
              local_1200 = 0;
              local_1210 = &local_1200;
              __cxa_throw(puVar16,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
            }
            _Var18 = _Var24 >> 0x10 & 0xff | _Var24 & 0x1f00;
            p_Var9 = &p_Var14->_M_header;
            p_Var11 = local_11e8.pmtPids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            if (_Var18 == _S_red) {
              bVar3 = true;
              TS_program_association_section::deserialize
                        (&local_11e8,(uint8_t *)((long)p_Var25 + (ulong)uVar6),0xbc - uVar6);
            }
            else {
              for (; (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
                  p_Var11 = (&p_Var11->_M_left)[(int)*(size_t *)(p_Var11 + 1) < (int)_Var18]) {
                if ((int)_Var18 <= (int)*(size_t *)(p_Var11 + 1)) {
                  p_Var9 = p_Var11;
                }
              }
              p_Var11 = &p_Var14->_M_header;
              if (((_Rb_tree_header *)p_Var9 != p_Var14) &&
                 (p_Var11 = p_Var9, (int)_Var18 < (int)p_Var9[1]._M_color)) {
                p_Var11 = &p_Var14->_M_header;
              }
              bVar3 = true;
              if (((_Rb_tree_header *)p_Var11 != p_Var14) &&
                 (((_Var24 >> 0xe & 1) != 0 || (0 < iVar5)))) {
                if ((int)((iVar5 - uVar6) + 0xbc) < 0x1001) {
                  memcpy(local_1038 + iVar5,(char *)((ulong)uVar6 + (long)p_Var25),
                         (long)(int)(0xbc - uVar6));
                  iVar7 = (byte)(char)p_Var25[1] + 5;
                  if ((*p_Var25 >> 0x1d & 1) == 0) {
                    iVar7 = 4;
                  }
                  iVar5 = (iVar5 - iVar7) + 0xbc;
                  bVar4 = TS_program_map_section::isFullBuff(local_1038,iVar5);
                  discardSize = local_11f0;
                  if (bVar4) {
                    TS_program_map_section::deserialize(local_1238,local_1038,iVar5);
                    iVar5 = 0;
                    if ((this->m_pmt).video_type != 0x20) {
                      this->m_nonMVCVideoFound = true;
                    }
                  }
                }
                else {
                  bVar3 = false;
                }
              }
            }
            if (!bVar3) break;
            p_Var25 = (_Rb_tree_color *)(this->m_curPos + 0xbc);
            this->m_curPos = (uint8_t *)p_Var25;
            bVar21 = 0;
          } while (p_Var25 <= end);
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::~_Rb_tree(&local_11e8.pmtPids._M_t);
      }
      this->m_curPos = (uint8_t *)local_1230;
      if (local_1230 <= end) {
        p_Var14 = &(this->m_pmt).pidList._M_t._M_impl.super__Rb_tree_header;
        local_1220 = &this->m_firstPtsTime;
        local_1218 = &(this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header;
        _Var24 = ~_S_red;
        local_1238 = (TS_program_map_section *)0x0;
        p_Var25 = local_1230;
        local_1240 = p_Var14;
        do {
          if ((this->m_m2tsHdrDiscarded == false) && (this->m_m2tsMode == true)) {
            *discardSize = *discardSize + 4;
            this->m_curPos = (uint8_t *)(p_Var25 + 1);
          }
          p_Var25 = (_Rb_tree_color *)this->m_curPos;
          if (end < p_Var25) {
LAB_001d745d:
            this->m_m2tsHdrDiscarded = true;
            break;
          }
          if ((char)*p_Var25 != 0x47) {
            lVar19 = *discardSize;
            do {
              p_Var25 = (_Rb_tree_color *)((long)p_Var25 + 1);
              lVar19 = lVar19 + 1;
              *discardSize = lVar19;
              this->m_curPos = (uint8_t *)p_Var25;
              if (end < p_Var25) goto LAB_001d745d;
            } while (*(undefined1 *)p_Var25 != 0x47);
          }
          if (end < p_Var25) goto LAB_001d745d;
          this->m_m2tsHdrDiscarded = false;
          local_11b0[0] = *p_Var25 >> 0x10 & 0xff | *p_Var25 & 0x1f00;
          *discardSize = *discardSize + 0xbc;
          lVar19 = (ulong)(byte)(char)p_Var25[1] + 5;
          if ((*p_Var25 >> 0x1d & 1) == 0) {
            lVar19 = 4;
          }
          this_01 = (PESPacket *)((long)p_Var25 + lVar19);
          if ((((*(char *)((long)p_Var25 + lVar19) == '\0') && (this_01->startCode1 == '\0')) &&
              ((*p_Var25 >> 0xe & 1) != 0)) && (this_01->startCode2 == '\x01')) {
            p_Var9 = (this->m_pmt).pidList._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var11 = &p_Var14->_M_header;
            for (; (_Rb_tree_header *)p_Var9 != (_Rb_tree_header *)0x0;
                p_Var9 = (&p_Var9->_M_left)[(int)*(size_t *)(p_Var9 + 1) < (int)local_11b0[0]]) {
              if ((int)local_11b0[0] <= (int)*(size_t *)(p_Var9 + 1)) {
                p_Var11 = p_Var9;
              }
            }
            p_Var22 = p_Var14;
            if (((_Rb_tree_header *)p_Var11 != p_Var14) &&
               (p_Var22 = (_Rb_tree_header *)p_Var11,
               (int)local_11b0[0] < (int)((_Rb_tree_header *)p_Var11)->_M_node_count)) {
              p_Var22 = p_Var14;
            }
            if ((char)this_01->flagsLo < '\0') {
              iVar12 = PESPacket::getPts(this_01);
              iVar13 = iVar12;
              if (0xbf < this_01->flagsLo) {
                iVar13 = PESPacket::getDts(this_01);
              }
              if ((this->m_lastPTS == -1) || (this->m_lastPTS < iVar12)) {
                this->m_lastPTS = iVar12;
              }
              if ((this->m_firstPTS == -1) || (iVar12 < this->m_firstPTS)) {
                this->m_firstPTS = iVar12;
              }
              if ((p_Var22 != local_1240) &&
                 (bVar3 = isVideoPID(*(StreamType *)(p_Var22 + 1)), bVar3)) {
                if ((this->m_firstVideoPTS == -1) || (iVar12 < this->m_firstVideoPTS)) {
                  this->m_firstVideoPTS = iVar12;
                }
                if (this->m_lastVideoPTS < iVar12) {
                  this->m_lastVideoPTS = iVar12;
                }
                if (this->m_lastVideoDTS == -1) {
                  this->m_lastVideoDTS = iVar13;
                }
                if ((this->m_videoDtsGap == -1) &&
                   (lVar19 = iVar13 - this->m_lastVideoDTS,
                   lVar19 != 0 && this->m_lastVideoDTS <= iVar13)) {
                  this->m_videoDtsGap = lVar19;
                }
              }
              p_Var14 = local_1218;
              for (p_Var9 = (this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_parent; (_Rb_tree_header *)p_Var9 != (_Rb_tree_header *)0x0;
                  p_Var9 = (&p_Var9->_M_left)[(int)*(size_t *)(p_Var9 + 1) < (int)local_11b0[0]]) {
                if ((int)local_11b0[0] <= (int)*(size_t *)(p_Var9 + 1)) {
                  p_Var14 = (_Rb_tree_header *)p_Var9;
                }
              }
              p_Var17 = local_1218;
              if ((p_Var14 != local_1218) &&
                 (p_Var17 = p_Var14, (int)local_11b0[0] < (int)p_Var14->_M_node_count)) {
                p_Var17 = local_1218;
              }
              if ((p_Var17 == local_1218) ||
                 ((p_Var14 = local_1240, this->m_curFileNum == 0 &&
                  (pmVar15 = std::
                             map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                             ::operator[](local_1220,(key_type_conflict *)local_11b0),
                  p_Var14 = local_1240, iVar12 < *pmVar15)))) {
                pmVar15 = std::
                          map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
                          ::operator[](local_1220,(key_type_conflict *)local_11b0);
                *pmVar15 = iVar12;
                p_Var14 = local_1240;
              }
            }
            if ((p_Var22 == p_Var14) || (*(int *)(p_Var22 + 1) == 0x90)) {
              lVar19 = this->m_firstVideoPTS;
              if (lVar19 == -1) {
                lVar19 = this->m_firstPTS;
              }
              if (this_01->flagsLo < 0xc0) {
                if ((char)this_01->flagsLo < '\0') {
                  iVar13 = PESPacket::getPts(this_01);
                  PESPacket::setPts(this_01,(iVar13 - lVar19) + this->m_prevFileLen);
                  p_Var14 = local_1240;
                }
              }
              else {
                iVar13 = PESPacket::getPts(this_01);
                lVar2 = this->m_prevFileLen;
                iVar12 = PESPacket::getDts(this_01);
                PESPacket::setPtsAndDts
                          (this_01,(iVar13 - lVar19) + lVar2,(iVar12 - lVar19) + this->m_prevFileLen
                          );
                p_Var14 = local_1240;
              }
            }
            else {
              this_01 = (PESPacket *)(&this_01->startCode0 + (byte)(this_01->m_pesHeaderLen + 9));
            }
          }
          if (this->m_acceptedPidCache[(int)local_11b0[0]] != '\0') {
            lVar19 = (long)this->m_curPos - (long)this_01;
            num = lVar19 + 0xbc;
            if (0 < (long)num) {
              this_00 = local_1238;
              if (local_11b0[0] != _Var24) {
                this_00 = (TS_program_map_section *)
                          std::
                          map<int,_MemoryBlock,_std::less<int>,_std::allocator<std::pair<const_int,_MemoryBlock>_>_>
                          ::operator[](demuxedData,(key_type_conflict *)local_11b0);
                p_Var14 = local_1240;
                _Var24 = local_11b0[0];
              }
              if (this_00 == (TS_program_map_section *)0x0) {
                local_1238 = (TS_program_map_section *)0x0;
              }
              else {
                MemoryBlock::grow((MemoryBlock *)this_00,num);
                puVar23 = (pointer)0x0;
                if (*(pointer *)this_00 != *(pointer *)&this_00->audio_pid) {
                  puVar23 = *(pointer *)this_00;
                }
                local_1238 = this_00;
                memcpy(puVar23 + (*(size_t *)&this_00->casPID - lVar19) + -0xbc,this_01,num);
                p_Var14 = local_1240;
              }
            }
            *discardSize = *discardSize - num;
          }
          p_Var25 = (_Rb_tree_color *)(this->m_curPos + 0xbc);
          this->m_curPos = (uint8_t *)p_Var25;
        } while (p_Var25 <= end);
      }
      __src = this->m_curPos;
      iVar5 = 0;
      if (__src < (uint8_t *)((long)local_1230 + (ulong)local_1244)) {
        sVar20 = (long)((long)local_1230 + (ulong)local_1244) - (long)__src;
        this->m_tmpBufferLen = sVar20;
        memmove(this->m_tmpBuffer,__src,sVar20);
      }
    }
  }
  return iVar5;
}

Assistant:

int TSDemuxer::simpleDemuxBlock(DemuxedData& demuxedData, const PIDSet& acceptedPIDs, int64_t& discardSize)
{
    if (m_firstDemuxCall)
    {
        for (const int acceptedPID : acceptedPIDs) m_acceptedPidCache[acceptedPID] = 1;
        m_firstDemuxCall = false;
    }

    uint8_t pmtBuffer[4096]{0};
    int pmtBufferLen = 0;
    MemoryBlock* vect = nullptr;
    int lastPid = -1;

    for (int acceptedPID : acceptedPIDs) demuxedData[acceptedPID];

    discardSize = 0;
    uint32_t readedBytes;
    int readRez = 0;
    bool isFirstBlock = false;
    uint8_t* data = m_bufferedReader->readBlock(m_readerID, readedBytes, readRez, &isFirstBlock);  // blocked read mode
    if (readRez == BufferedFileReader::DATA_NOT_READY)
    {
        m_lastReadRez = readRez;
        return BufferedFileReader::DATA_NOT_READY;
    }
    if (readedBytes + m_tmpBufferLen == 0 || (readedBytes == 0 && m_lastReadRez == BufferedReader::DATA_EOF))
    {
        m_lastReadRez = readRez;
        return BufferedReader::DATA_EOF;
    }
    if (readedBytes > 0)
        m_bufferedReader->notify(m_readerID, readedBytes);
    m_lastReadRez = readRez;
    data += TS_FRAME_SIZE;
    if (m_tmpBufferLen > 0)
    {
        memcpy(data - m_tmpBufferLen, m_tmpBuffer, m_tmpBufferLen);
        data -= m_tmpBufferLen;
        readedBytes += static_cast<uint32_t>(m_tmpBufferLen);
        m_tmpBufferLen = 0;
    }

    if (isFirstBlock)
    {
        if (m_curFileNum < m_mplsInfo.size())
            m_prevFileLen +=
                static_cast<int64_t>(m_mplsInfo[m_curFileNum].OUT_time - m_mplsInfo[m_curFileNum].IN_time) *
                2;  // in 90Khz clock
        else
        {
            if (m_firstVideoPTS != -1 && m_lastVideoPTS != -1)
                m_prevFileLen += (m_lastVideoPTS - m_firstVideoPTS + m_videoDtsGap);
            else  // no video file
                m_prevFileLen += (m_lastPTS - m_firstPTS);
        }
        m_firstPTS = -1;
        m_lastPTS = -1;
        m_firstVideoPTS = -1;
        m_lastVideoPTS = -1;
        m_curFileNum++;
    }

    discardSize = 0;

    if (readedBytes < TS_FRAME_SIZE)
    {
        discardSize += readedBytes;
        return 0;
    }

    const uint8_t* lastFrameAddr = data + readedBytes - TS_FRAME_SIZE;

    if (m_firstCall && !m_m2tsMode)
    {
        m_m2tsMode = checkForRealM2ts(data, lastFrameAddr);
        m_firstCall = false;
    }

    bool forpmtm2tsHdrDiscarded = m_m2tsHdrDiscarded;
    if (m_pmt.pidList.empty() || mvcContinueExpected())
    {
        TS_program_association_section pat;
        for (m_curPos = data; m_curPos <= lastFrameAddr; m_curPos += TS_FRAME_SIZE)
        {
            if (!forpmtm2tsHdrDiscarded && m_m2tsMode)
                m_curPos += 4;
            while (*m_curPos != 0x47 && m_curPos <= lastFrameAddr) m_curPos++;
            if (m_curPos > lastFrameAddr)
                break;
            forpmtm2tsHdrDiscarded = false;

            const auto tsPacket = reinterpret_cast<TSPacket*>(m_curPos);
            int pid = tsPacket->getPID();
            if (TS_FRAME_SIZE < tsPacket->getHeaderSize())
            {
                THROW(ERR_COMMON, "Invalid tsPacket->getHeaderSize")
                break;
            }
            if (pid == 0)
            {  // PAT
                pat.deserialize(m_curPos + tsPacket->getHeaderSize(), TS_FRAME_SIZE - tsPacket->getHeaderSize());
            }
            else if (pat.pmtPids.find(pid) != pat.pmtPids.end())
            {  // PMT
                if (tsPacket->payloadStart || pmtBufferLen > 0)
                {
                    if (pmtBufferLen + TS_FRAME_SIZE - tsPacket->getHeaderSize() > 4096)
                        break;
                    memcpy(pmtBuffer + pmtBufferLen, m_curPos + tsPacket->getHeaderSize(),
                           TS_FRAME_SIZE - tsPacket->getHeaderSize());
                    pmtBufferLen += TS_FRAME_SIZE - tsPacket->getHeaderSize();
                    if (TS_program_map_section::isFullBuff(pmtBuffer, pmtBufferLen))
                    {
                        m_pmt.deserialize(pmtBuffer, pmtBufferLen);
                        if (m_pmt.video_type != static_cast<int>(StreamType::VIDEO_MVC))
                            m_nonMVCVideoFound = true;
                        pmtBufferLen = 0;
                    }
                }
            }
        }
    }

    for (m_curPos = data; m_curPos <= lastFrameAddr; m_curPos += TS_FRAME_SIZE)
    {
        if (!m_m2tsHdrDiscarded && m_m2tsMode)
        {
            discardSize += 4;
            m_curPos += 4;
        }
        while (m_curPos <= lastFrameAddr && *m_curPos != 0x47)
        {
            discardSize++;
            m_curPos++;
        }
        if (m_curPos > lastFrameAddr)
        {
            m_m2tsHdrDiscarded = true;
            break;
        }
        m_m2tsHdrDiscarded = false;

        const auto tsPacket = reinterpret_cast<TSPacket*>(m_curPos);
        int pid = tsPacket->getPID();
        discardSize += TS_FRAME_SIZE;

        // pcrFrames++;

        if (tsPacket->afExists)
        {
            if (tsPacket->adaptiveField.pcrExist)
            {
                // if (prevPCR == -1)
                //	prevPCR = tsPacket->adaptiveField.getPCR33();

                // prevPCR = tsPacket->adaptiveField.getPCR33();
                // LTRACE(LT_INFO, 2, "pcr: " << prevPCR - 55729419ll);
                // pcrFrames = 0;
            }
        }

        uint8_t* frameData = m_curPos + tsPacket->getHeaderSize();
        const bool pesStartCode = frameData[0] == 0 && frameData[1] == 0 && frameData[2] == 1 && tsPacket->payloadStart;
        if (pesStartCode)
        {
            const auto pesPacket = reinterpret_cast<PESPacket*>(frameData);
            auto streamInfo = m_pmt.pidList.find(pid);

            if ((pesPacket->flagsLo & 0x80) == 0x80)
            {
                const int64_t curPts = pesPacket->getPts();
                int64_t curDts = curPts;

                if ((pesPacket->flagsLo & 0xc0) == 0xc0)
                    curDts = pesPacket->getDts();

                if (m_lastPTS == -1 || curPts > m_lastPTS)
                    m_lastPTS = curPts;

                if (m_firstPTS == -1 || curPts < m_firstPTS)
                    m_firstPTS = curPts;

                if (streamInfo != m_pmt.pidList.end() && isVideoPID(streamInfo->second.m_streamType))
                {
                    if (m_firstVideoPTS == -1 || curPts < m_firstVideoPTS)
                        m_firstVideoPTS = curPts;
                    if (curPts > m_lastVideoPTS)
                        m_lastVideoPTS = curPts;
                    if (m_lastVideoDTS == -1)
                        m_lastVideoDTS = curDts;
                    if (m_videoDtsGap == -1 && curDts > m_lastVideoDTS)
                        m_videoDtsGap = curDts - m_lastVideoDTS;
                }

                if (m_firstPtsTime.find(pid) == m_firstPtsTime.end() ||
                    (m_curFileNum == 0 && curPts < m_firstPtsTime[pid]))
                    m_firstPtsTime[pid] = curPts;
            }

            if (streamInfo != m_pmt.pidList.end() &&
                streamInfo->second.m_streamType != StreamType::SUB_PGS)  // demux PGS with PES headers
                frameData += pesPacket->getHeaderLength();
            else
            {
                const int64_t ptsBase = m_firstVideoPTS != -1 ? m_firstVideoPTS : m_firstPTS;
                if ((pesPacket->flagsLo & 0xc0) == 0xc0)
                {
                    const int64_t pts = pesPacket->getPts() - ptsBase + m_prevFileLen;
                    const int64_t dts = pesPacket->getDts() - ptsBase + m_prevFileLen;
                    pesPacket->setPtsAndDts(pts, dts);
                }
                else if ((pesPacket->flagsLo & 0x80) == 0x80)
                {
                    const int64_t pts = pesPacket->getPts() - ptsBase + m_prevFileLen;
                    pesPacket->setPts(pts);
                }
            }
        }

        // if (acceptedPIDs.find(pid) == acceptedPIDs.end())
        if (!m_acceptedPidCache[pid])
            continue;

        const int64_t payloadLen = TS_FRAME_SIZE - (frameData - m_curPos);
        if (payloadLen > 0)
        {
            if (pid != lastPid)
            {
                vect = &demuxedData[pid];
                lastPid = pid;
            }
            if (vect != nullptr)
            {
                vect->grow(payloadLen);
                uint8_t* dst = vect->data() + vect->size() - payloadLen;
                memcpy(dst, frameData, payloadLen);
            }
        }
        discardSize -= payloadLen;
    }
    if (m_curPos < data + readedBytes)
    {
        m_tmpBufferLen = data + readedBytes - m_curPos;
        memmove(m_tmpBuffer, m_curPos, m_tmpBufferLen);
    }

    return 0;
}